

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O2

ALLEGRO_THREAD * al_create_thread(_func_void_ptr_ALLEGRO_THREAD_ptr_void_ptr *proc,void *arg)

{
  ALLEGRO_THREAD *thread;
  
  thread = create_thread();
  thread->thread_state = THREAD_STATE_CREATED;
  _al_mutex_init(&thread->mutex);
  _al_cond_init(&thread->cond);
  thread->arg = arg;
  thread->proc = proc;
  _al_thread_create(&thread->thread,thread_func_trampoline,thread);
  return thread;
}

Assistant:

ALLEGRO_THREAD *al_create_thread(
   void *(*proc)(ALLEGRO_THREAD *thread, void *arg), void *arg)
{
   ALLEGRO_THREAD *outer = create_thread();
   outer->thread_state = THREAD_STATE_CREATED;
   _al_mutex_init(&outer->mutex);
   _al_cond_init(&outer->cond);
   outer->arg = arg;
   outer->proc = proc;
   _al_thread_create(&outer->thread, thread_func_trampoline, outer);
   /* XXX _al_thread_create should return an error code */
   return outer;
}